

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

size_t Jupiter_minBase64DecodeLength(char *data,size_t inLen)

{
  size_t inLen_local;
  char *data_local;
  
  if (inLen == 0) {
    data_local = (char *)0x0;
  }
  else if (data[inLen - 1] == '=') {
    if ((data + (inLen - 1))[-1] == '=') {
      data_local = (char *)((inLen >> 2) * 3 + -2);
    }
    else {
      data_local = (char *)((inLen >> 2) * 3 + -1);
    }
  }
  else {
    data_local = (char *)((inLen >> 2) * 3);
  }
  return (size_t)data_local;
}

Assistant:

size_t Jupiter_minBase64DecodeLength(const char *data, size_t inLen)
{
	if (inLen == 0) return 0;
	data += inLen - 1;
	if (*data == '=')
	{
		data--;
		if (*data == '=')
			return inLen / 4 * 3 - 2;

		return inLen / 4 * 3 - 1;
	}
	return inLen / 4 * 3;
}